

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CluCheckDecOut(word t,int nVars)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar2 = 0;
  }
  lVar3 = 0;
  do {
    if (uVar2 * 8 == lVar3) {
      return 0;
    }
    uVar1 = *(ulong *)((long)Truth6 + lVar3);
  } while (((((uVar1 & t) != 0) && ((uVar1 & ~t) != 0)) && ((~uVar1 & t) != 0)) &&
          (lVar3 = lVar3 + 8, (uVar1 | t) != 0xffffffffffffffff));
  return 1;
}

Assistant:

int If_CluCheckDecOut( word t, int nVars )
{
    int v;
    for ( v = 0; v < nVars; v++ )
        if ( 
             (t & Truth6[v]) == 0   ||  //  F * !a
             (~t & Truth6[v]) == 0  ||  // !F * !a
             (t & ~Truth6[v]) == 0  ||  //  F *  a
             (~t & ~Truth6[v]) == 0     // !F *  a   
           )
            return 1;
    return 0;
}